

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O3

_Bool run_bitset_container_intersect(run_container_t *src_1,bitset_container_t *src_2)

{
  ushort uVar1;
  rle16_t *prVar2;
  uint64_t *puVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  
  uVar7 = (ulong)(uint)src_1->n_runs;
  prVar2 = src_1->runs;
  if ((uVar7 == 1) && (prVar2->value == 0)) {
    if (prVar2->length == 0xffff) {
      if (src_2->cardinality != -1) {
        return src_2->cardinality != 0;
      }
      lVar5 = 0;
      do {
        bVar10 = src_2->words[lVar5] != 0;
        if (bVar10) {
          return bVar10;
        }
        bVar11 = lVar5 != 0x3ff;
        lVar5 = lVar5 + 1;
      } while (bVar11);
      return bVar10;
    }
  }
  else if (src_1->n_runs < 1) {
    return false;
  }
  puVar3 = src_2->words;
  uVar8 = 0;
  do {
    uVar1 = prVar2[uVar8].value;
    uVar9 = (ulong)(uint)(uVar1 >> 6);
    uVar4 = (uint)uVar1 + (uint)prVar2[uVar8].length;
    uVar6 = uVar4 >> 6;
    if (uVar1 >> 6 == uVar6) {
      if (((0xffffffffffffffffU >> (0x3fU - (char)prVar2[uVar8].length & 0x3f)) <<
           ((byte)uVar1 & 0x3f) & puVar3[uVar9]) != 0) {
        return true;
      }
    }
    else {
      if (puVar3[uVar9] >> ((byte)uVar1 & 0x3f) != 0) {
        return true;
      }
      while (uVar9 = uVar9 + 1, uVar9 < uVar6) {
        if (puVar3[uVar9] != 0) {
          return true;
        }
      }
      if (puVar3[uVar6] << (~(byte)uVar4 & 0x3f) != 0) {
        return true;
      }
    }
    uVar8 = uVar8 + 1;
    if (uVar8 == uVar7) {
      return uVar8 < uVar7;
    }
  } while( true );
}

Assistant:

bool run_bitset_container_intersect(const run_container_t *src_1,
                                    const bitset_container_t *src_2) {
    if (run_container_is_full(src_1)) {
        return !bitset_container_empty(src_2);
    }
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        if (!bitset_lenrange_empty(src_2->words, rle.value, rle.length))
            return true;
    }
    return false;
}